

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O1

void IoTHubClient_Auth_Destroy(IOTHUB_AUTHORIZATION_HANDLE handle)

{
  if (handle != (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    iothub_device_auth_destroy(handle->device_auth_handle);
    free(handle->device_key);
    free(handle->device_id);
    free(handle->module_id);
    free(handle->device_sas_token);
    free(handle);
    return;
  }
  return;
}

Assistant:

void IoTHubClient_Auth_Destroy(IOTHUB_AUTHORIZATION_HANDLE handle)
{
    if (handle != NULL)
    {
#ifdef USE_PROV_MODULE
        iothub_device_auth_destroy(handle->device_auth_handle);
#endif
        free(handle->device_key);
        free(handle->device_id);
        free(handle->module_id);
        free(handle->device_sas_token);
        free(handle);
    }
}